

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O1

zt_log_ctx_ty * zt_log_get_ctx(void)

{
  zt_log_ctx_ty *pzVar1;
  undefined8 *extraout_RDX;
  int *piVar2;
  undefined8 *puVar3;
  
  pthread_once(&ctx_key_once,make_ctx_key);
  pzVar1 = (zt_log_ctx_ty *)pthread_getspecific(ctx_key);
  if (pzVar1 == (zt_log_ctx_ty *)0x0) {
    puVar3 = (undefined8 *)0x1;
    piVar2 = (int *)0x18;
    pzVar1 = (zt_log_ctx_ty *)zt_calloc_p(1,0x18);
    if (pzVar1 == (zt_log_ctx_ty *)0x0) {
      zt_log_get_ctx_cold_1();
      pzVar1 = zt_log_get_ctx();
      *puVar3 = pzVar1->file;
      *piVar2 = pzVar1->line;
      pzVar1 = (zt_log_ctx_ty *)pzVar1->function;
      *extraout_RDX = pzVar1;
      return pzVar1;
    }
    pthread_setspecific(ctx_key,pzVar1);
  }
  return pzVar1;
}

Assistant:

static zt_log_ctx_ty *
zt_log_get_ctx(void) {
    CTX_STATIC zt_log_ctx_ty * log_ctx_ptr = NULL;

    if (!log_ctx_ptr) {
#ifdef HAVE_PTHREADS
        (void)pthread_once(&ctx_key_once, make_ctx_key);
        if ((log_ctx_ptr = pthread_getspecific(ctx_key)) == NULL) {
#endif /* HAVE_PTHREADS */
        if ((log_ctx_ptr = zt_calloc(zt_log_ctx_ty, 1)) == NULL) {
            fprintf(stderr, "Could not allocate memory for log context\n");
            exit(1);
        }
#ifdef HAVE_PTHREADS
        pthread_setspecific(ctx_key, log_ctx_ptr);
    }
#endif /* HAVE_PTHREADS */
    }
    return log_ctx_ptr;
}